

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O3

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::Map,_(ritobin::Category)7>::from_json
          (ErrorStackOption *__return_storage_ptr__,Map *value,json *json)

{
  bool bVar1;
  const_iterator cVar2;
  const_reference pvVar3;
  reference this;
  reference value_00;
  char *pcVar4;
  _Rb_tree_header *type;
  size_t index;
  long lVar5;
  _Alloc_hider _Var6;
  json_impl *this_00;
  string_view type_name;
  string_view type_name_00;
  string valueType_name;
  string keyType_name;
  const_iterator __end3;
  const_iterator __begin3;
  undefined1 local_1c8 [72];
  vector<ritobin::Pair,std::allocator<ritobin::Pair>> *local_180;
  string local_178;
  undefined1 local_158 [72];
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_70;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  if (json->m_type == object) {
    cVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
            ::_M_find_tr<char[10],void>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                        *)(json->m_value).object,(char (*) [10])"valueType");
    if (cVar2._M_node ==
        (_Base_ptr)
        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
          *)(json->m_value).object + 8)) {
      (__return_storage_ptr__->
      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
      super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
           "map";
      pcVar4 = "json.contains(\"valueType\")";
      goto LAB_00129778;
    }
    if (json->m_type == object) {
      cVar2 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[8],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(json->m_value).object,(char (*) [8])"keyType");
      if (cVar2._M_node !=
          (_Base_ptr)
          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
            *)(json->m_value).object + 8)) {
        if (json->m_type == object) {
          cVar2 = std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  ::_M_find_tr<char[6],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                              *)(json->m_value).object,(char (*) [6])"items");
          type = &(((json->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar2._M_node != type) {
            pvVar3 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)json,"valueType");
            if (pvVar3->m_type != string) {
              (__return_storage_ptr__->
              super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
              super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
              super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.
              type = "map";
              pcVar4 = "json[\"valueType\"].is_string()";
              goto LAB_00129778;
            }
            pvVar3 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)json,"keyType");
            if (pvVar3->m_type != string) {
              (__return_storage_ptr__->
              super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
              super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
              super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.
              type = "map";
              pcVar4 = "json[\"keyType\"].is_string()";
              goto LAB_00129778;
            }
            pvVar3 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)json,"items");
            if (pvVar3->m_type != array) {
              (__return_storage_ptr__->
              super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
              super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
              super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.
              type = "map";
              pcVar4 = "json[\"items\"].is_array()";
              goto LAB_00129778;
            }
            pvVar3 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)json,"keyType");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_d0,pvVar3);
            pvVar3 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)json,"valueType");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_f0,pvVar3);
            type_name._M_str = (char *)value;
            type_name._M_len = (size_t)local_d0._M_dataplus._M_p;
            bVar1 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                    ::try_type_name_to_type
                              ((ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                                *)local_d0._M_string_length,type_name,(Type *)type);
            if (bVar1) {
              type_name_00._M_str = (char *)&value->valueType;
              type_name_00._M_len = (size_t)local_f0._M_dataplus._M_p;
              bVar1 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                      ::try_type_name_to_type
                                ((ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                                  *)local_f0._M_string_length,type_name_00,(Type *)type);
              if (bVar1) {
                pvVar3 = nlohmann::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                     *)json,"items");
                local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
                local_50.m_it.array_iterator._M_current =
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)0x0;
                local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
                local_50.m_object = pvVar3;
                nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::set_begin(&local_50);
                local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
                local_70.m_it.array_iterator._M_current =
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)0x0;
                local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
                local_70.m_object = pvVar3;
                nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::set_end(&local_70);
                local_180 = (vector<ritobin::Pair,std::allocator<ritobin::Pair>> *)&value->items;
                this_00 = (json_impl *)0x0;
                while (bVar1 = nlohmann::detail::
                               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator==(&local_50,&local_70), !bVar1) {
                  this = nlohmann::detail::
                         iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*(&local_50);
                  ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                  ::type_to_value((Value *)local_1c8,value->keyType);
                  ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                  ::type_to_value((Value *)local_158,value->valueType);
                  value_00 = std::vector<ritobin::Pair,std::allocator<ritobin::Pair>>::
                             emplace_back<std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>
                                       (local_180,
                                        (variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                         *)local_1c8,(Value *)local_158);
                  std::__detail::__variant::
                  _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                  ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                       *)local_158);
                  std::__detail::__variant::
                  _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                  ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                       *)local_1c8);
                  if (this->m_type == object) {
                    cVar2 = std::
                            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                            ::_M_find_tr<char[4],void>
                                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                        *)(this->m_value).object,(char (*) [4])0x13c45d);
                    if (cVar2._M_node ==
                        (_Base_ptr)
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(this->m_value).object + 8)) {
                      (__return_storage_ptr__->
                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                      _M_payload.
                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                      .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                      _M_value.type = "pair";
                      pcVar4 = "json.contains(\"key\")";
                      goto LAB_00129637;
                    }
                    if ((this->m_type != object) ||
                       (cVar2 = std::
                                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                ::_M_find_tr<char[6],void>
                                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                            *)(this->m_value).object,(char (*) [6])"value"),
                       (_Rb_tree_header *)cVar2._M_node ==
                       &(((this->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
                      (__return_storage_ptr__->
                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                      _M_payload.
                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                      .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                      _M_value.type = "pair";
                      pcVar4 = "json.contains(\"value\")";
                      goto LAB_00129637;
                    }
                    pvVar3 = nlohmann::
                             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             ::operator[]<char_const>
                                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                         *)this,"key");
                    value_from_json(__return_storage_ptr__,&value_00->key,pvVar3);
                    if ((__return_storage_ptr__->
                        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                        _M_payload.
                        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                        .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged
                        == true) {
                      local_158._0_8_ = local_158 + 0x10;
                      local_158[0x12] = 'y';
                      local_158._16_2_ = 0x656b;
                      local_158._8_8_ = 3;
                      local_158[0x13] = '\0';
                      to_index((string *)local_1c8,(string *)local_158);
                      ErrorStack::push((ErrorStack *)__return_storage_ptr__,(string *)local_1c8);
                      if ((undefined1 *)CONCAT17(local_1c8[7],local_1c8._0_7_) != local_1c8 + 0x10)
                      {
                        operator_delete((undefined1 *)CONCAT17(local_1c8[7],local_1c8._0_7_),
                                        local_1c8._16_8_ + 1);
                      }
                      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                        lVar5 = CONCAT44(local_158._20_4_,
                                         CONCAT13(local_158[0x13],
                                                  CONCAT12(local_158[0x12],local_158._16_2_)));
                        _Var6._M_p = (pointer)local_158._0_8_;
LAB_00129718:
                        operator_delete(_Var6._M_p,lVar5 + 1);
                      }
                    }
                    else {
                      pvVar3 = nlohmann::
                               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               ::operator[]<char_const>
                                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                           *)this,"value");
                      value_from_json(__return_storage_ptr__,&value_00->value,pvVar3);
                      if ((__return_storage_ptr__->
                          super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                          _M_payload.
                          super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                          .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                          _M_engaged == true) {
                        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
                        local_178.field_2._M_local_buf[4] = 'e';
                        local_178.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
                        local_178._M_string_length = 5;
                        local_178.field_2._M_local_buf[5] = '\0';
                        to_index(&local_90,&local_178);
                        ErrorStack::push((ErrorStack *)__return_storage_ptr__,&local_90);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_90._M_dataplus._M_p != &local_90.field_2) {
                          operator_delete(local_90._M_dataplus._M_p,
                                          local_90.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_178._M_dataplus._M_p != &local_178.field_2) {
                          lVar5 = CONCAT26(local_178.field_2._M_allocated_capacity._6_2_,
                                           CONCAT15(local_178.field_2._M_local_buf[5],
                                                    CONCAT14(local_178.field_2._M_local_buf[4],
                                                             local_178.field_2._M_allocated_capacity
                                                             ._0_4_)));
                          _Var6._M_p = local_178._M_dataplus._M_p;
                          goto LAB_00129718;
                        }
                      }
                      else {
                        (__return_storage_ptr__->
                        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                        _M_payload.
                        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                        .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged
                             = false;
                      }
                    }
                  }
                  else {
                    (__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                    _M_value.type = "pair";
                    pcVar4 = "json.is_object()";
LAB_00129637:
                    (__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                    _M_value.message = pcVar4;
                    (__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                    _M_value.path._M_dataplus._M_p =
                         (pointer)((long)&(__return_storage_ptr__->
                                          super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                                          )._M_payload.
                                          super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>
                                          ._M_payload + 0x20);
                    *(undefined1 *)
                     ((long)&(__return_storage_ptr__->
                             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
                             ._M_payload.
                             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                             .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                             _M_payload + 0x20) = 0;
                    (__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                    _M_value.path._M_string_length = 0;
                    (__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged =
                         true;
                  }
                  if ((__return_storage_ptr__->
                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                      _M_payload.
                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                      .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged
                      == true) {
                    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"items","")
                    ;
                    to_index((string *)local_1c8,&local_110);
                    to_index_abi_cxx11_((string *)local_158,this_00,index);
                    std::operator+(&local_b0,(string *)local_1c8,(string *)local_158);
                    ErrorStack::push((ErrorStack *)__return_storage_ptr__,&local_b0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      local_b0.field_2._M_allocated_capacity + 1);
                    }
                    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                      operator_delete((void *)local_158._0_8_,
                                      CONCAT44(local_158._20_4_,
                                               CONCAT13(local_158[0x13],
                                                        CONCAT12(local_158[0x12],local_158._16_2_)))
                                      + 1);
                    }
                    if ((undefined1 *)CONCAT17(local_1c8[7],local_1c8._0_7_) != local_1c8 + 0x10) {
                      operator_delete((undefined1 *)CONCAT17(local_1c8[7],local_1c8._0_7_),
                                      local_1c8._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_110._M_dataplus._M_p != &local_110.field_2) {
                      operator_delete(local_110._M_dataplus._M_p,
                                      local_110.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_00129846;
                  }
                  this_00 = this_00 + 1;
                  nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator++(&local_50);
                }
                (__return_storage_ptr__->
                super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
                super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
                goto LAB_00129846;
              }
              (__return_storage_ptr__->
              super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
              super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
              super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.
              type = "map";
              pcVar4 = "ValueHelper::try_type_name_to_type(valueType_name, value.valueType)";
            }
            else {
              (__return_storage_ptr__->
              super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
              super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
              super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.
              type = "map";
              pcVar4 = "ValueHelper::try_type_name_to_type(keyType_name, value.keyType)";
            }
            (__return_storage_ptr__->
            super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
            super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
            super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.
            message = pcVar4;
            (__return_storage_ptr__->
            super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
            super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
            super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.
            path._M_dataplus._M_p =
                 (pointer)((long)&(__return_storage_ptr__->
                                  super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                                  .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                                  _M_payload + 0x20);
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                     _M_payload.
                     super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                     .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload +
             0x20) = 0;
            *(ulong *)((long)&(__return_storage_ptr__->
                              super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                              )._M_payload.
                              super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                              .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                              _M_payload._M_value.path.field_2 + 1) =
                 CONCAT17(local_1c8[7],local_1c8._0_7_);
            *(ulong *)((long)&(__return_storage_ptr__->
                              super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>
                              )._M_payload.
                              super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                              .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                              _M_payload._M_value.path.field_2 + 8) =
                 CONCAT71(local_1c8._8_7_,local_1c8[7]);
            (__return_storage_ptr__->
            super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
            super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
            super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.
            path._M_string_length = 0;
            (__return_storage_ptr__->
            super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
            super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
            super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
LAB_00129846:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
              return __return_storage_ptr__;
            }
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            return __return_storage_ptr__;
          }
        }
        (__return_storage_ptr__->
        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
        super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
             "map";
        pcVar4 = "json.contains(\"items\")";
        goto LAB_00129778;
      }
    }
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
         "map";
    pcVar4 = "json.contains(\"keyType\")";
  }
  else {
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
         "map";
    pcVar4 = "json.is_object()";
  }
LAB_00129778:
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.message =
       pcVar4;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_dataplus._M_p =
       (pointer)((long)&(__return_storage_ptr__->
                        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                        _M_payload.
                        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                        .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload
                + 0x20);
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
           super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
           super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x20) = 0;
  *(ulong *)((long)&(__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                    _M_value.path.field_2 + 1) = CONCAT17(local_1c8[7],local_1c8._0_7_);
  *(ulong *)((long)&(__return_storage_ptr__->
                    super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                    _M_payload.
                    super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload.
                    _M_value.path.field_2 + 8) = CONCAT71(local_1c8._8_7_,local_1c8[7]);
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
  _M_string_length = 0;
  (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
  _M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_object());
            bin_json_assert(json.contains("valueType"));
            bin_json_assert(json.contains("keyType"));
            bin_json_assert(json.contains("items"));
            bin_json_assert(json["valueType"].is_string());
            bin_json_assert(json["keyType"].is_string());
            bin_json_assert(json["items"].is_array());
            std::string keyType_name = json["keyType"];
            std::string valueType_name = json["valueType"];
            bin_json_assert(ValueHelper::try_type_name_to_type(keyType_name, value.keyType));
            bin_json_assert(ValueHelper::try_type_name_to_type(valueType_name, value.valueType));
            auto const& json_items = json["items"];
            size_t index = 0;
            for (auto const& json_item: json_items) {
                auto& value_item = value.items.emplace_back(ValueHelper::type_to_value(value.keyType),
                                                            ValueHelper::type_to_value(value.valueType));
                bin_json_rethrow(to_index("items") + to_index(index),
                                 item_from_json(value_item, json_item));
                ++index;
            }
            return std::nullopt;
        }